

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTinySVD.cpp
# Opt level: O0

void verifyTinySVD_4x4<double>(Matrix44<double> *A)

{
  double dVar1;
  double *pdVar2;
  Matrix44 *in_RDI;
  Matrix44 *pMVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  int i_5;
  int i_4;
  int j_2;
  int i_3;
  Matrix44<double> product;
  int j_1;
  int i_2;
  Matrix44<double> S_times_Vt;
  Vec4<double> S;
  Matrix44<double> V;
  Matrix44<double> U;
  bool posDet;
  int i_1;
  double valueEps;
  double eps;
  int j;
  int i;
  double maxEntry;
  Matrix44<double> *in_stack_fffffffffffffd70;
  Matrix44<double> *in_stack_fffffffffffffd78;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  Matrix44<double> *in_stack_fffffffffffffda0;
  int local_1e0;
  int local_1dc;
  Matrix44<double> *in_stack_fffffffffffffe30;
  Matrix44<double> *in_stack_fffffffffffffe80;
  Vec4<double> local_158;
  Matrix44<double> local_138;
  Matrix44<double> local_b8;
  byte local_35;
  int local_34;
  double local_30;
  double local_28;
  double local_20;
  int local_18;
  int local_14;
  double local_10;
  Matrix44 *local_8;
  
  local_10 = 0.0;
  local_8 = in_RDI;
  for (local_14 = 0; local_14 < 4; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      pMVar3 = local_8;
      Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)local_8,local_14);
      std::abs((int)pMVar3);
      pdVar2 = std::max<double>(&local_10,&local_20);
      local_10 = *pdVar2;
    }
  }
  local_28 = std::numeric_limits<double>::epsilon();
  local_30 = local_10 * 100.0 * 2.220446049250313e-16;
  local_34 = 0;
  while( true ) {
    if (1 < local_34) {
      return;
    }
    local_35 = local_34 == 0;
    Imath_3_2::Matrix44<double>::Matrix44(&local_b8);
    Imath_3_2::Matrix44<double>::Matrix44(&local_138);
    Imath_3_2::Vec4<double>::Vec4(&local_158);
    Imath_3_2::jacobiSVD<double>
              (local_8,(Matrix44 *)&local_b8,(Vec4 *)&local_158,(Matrix44 *)&local_138,
               2.220446049250313e-16,(bool)(local_35 & 1));
    Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)&stack0xfffffffffffffe28);
    for (local_1dc = 0; local_1dc < 4; local_1dc = local_1dc + 1) {
      for (local_1e0 = 0; local_1e0 < 4; local_1e0 = local_1e0 + 1) {
        pdVar2 = Imath_3_2::Vec4<double>::operator[](&local_158,local_1e0);
        dVar4 = *pdVar2;
        pdVar2 = Imath_3_2::Matrix44<double>::operator[](&local_138,local_1dc);
        dVar1 = pdVar2[local_1e0];
        pdVar2 = Imath_3_2::Matrix44<double>::operator[]
                           ((Matrix44<double> *)&stack0xfffffffffffffe28,local_1dc);
        pdVar2[local_1e0] = dVar4 * dVar1;
      }
    }
    Imath_3_2::Matrix44<double>::transpose(in_stack_fffffffffffffe30);
    Imath_3_2::Matrix44<double>::operator*(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    for (local_264 = 0; local_264 < 4; local_264 = local_264 + 1) {
      for (local_268 = 0; local_268 < 4; local_268 = local_268 + 1) {
        pdVar2 = Imath_3_2::Matrix44<double>::operator[]
                           ((Matrix44<double> *)&stack0xfffffffffffffda0,local_264);
        in_stack_fffffffffffffd78 = (Matrix44<double> *)pdVar2[local_268];
        pMVar3 = local_8;
        Imath_3_2::Matrix44<double>::operator[]((Matrix44<double> *)local_8,local_264);
        std::abs((int)pMVar3);
        if (local_30 < extraout_XMM0_Qa) {
          __assert_fail("std::abs (product[i][j] - A[i][j]) <= valueEps",
                        "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                        ,0x8b,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]")
          ;
        }
      }
    }
    if ((local_35 & 1) != 0) {
      dVar4 = Imath_3_2::Matrix44<double>::determinant(in_stack_fffffffffffffda0);
      if (dVar4 <= 0.99) {
        __assert_fail("U.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x90,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
      dVar4 = Imath_3_2::Matrix44<double>::determinant(in_stack_fffffffffffffda0);
      if (dVar4 <= 0.99) {
        __assert_fail("V.determinant () > 0.99",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x91,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    for (local_26c = 0; local_26c < 3; local_26c = local_26c + 1) {
      pdVar2 = Imath_3_2::Vec4<double>::operator[](&local_158,local_26c);
      in_stack_fffffffffffffd70 = (Matrix44<double> *)*pdVar2;
      pdVar2 = Imath_3_2::Vec4<double>::operator[](&local_158,local_26c + 1);
      if ((double)in_stack_fffffffffffffd70 < *pdVar2) {
        __assert_fail("S[i] >= S[i + 1]",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x96,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    for (local_270 = 0; local_270 < 3; local_270 = local_270 + 1) {
      pdVar2 = Imath_3_2::Vec4<double>::operator[](&local_158,local_270);
      if (*pdVar2 < 0.0) {
        __assert_fail("S[i] >= T (0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                      ,0x9a,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
      }
    }
    if (((local_35 & 1) == 0) &&
       (pdVar2 = Imath_3_2::Vec4<double>::operator[](&local_158,3), *pdVar2 < 0.0)) break;
    verifyOrthonormal<double>(in_stack_fffffffffffffe80);
    verifyOrthonormal<double>(in_stack_fffffffffffffe80);
    local_34 = local_34 + 1;
  }
  __assert_fail("S[3] >= T (0)",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testTinySVD.cpp"
                ,0x9c,"void verifyTinySVD_4x4(const Imath_3_2::Matrix44<T> &) [T = double]");
}

Assistant:

void
verifyTinySVD_4x4 (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T maxEntry = 0;
    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            maxEntry = std::max (maxEntry, std::abs (A[i][j]));

    const T eps      = std::numeric_limits<T>::epsilon ();
    const T valueEps = maxEntry * T (100) * eps;

    for (int i = 0; i < 2; ++i)
    {
        const bool posDet = (i == 0);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> U, V;
        IMATH_INTERNAL_NAMESPACE::Vec4<T>     S;
        IMATH_INTERNAL_NAMESPACE::jacobiSVD (A, U, S, V, eps, posDet);

        IMATH_INTERNAL_NAMESPACE::Matrix44<T> S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                S_times_Vt[i][j] = S[j] * V[i][j];
        S_times_Vt.transpose ();

        // Verify that the product of the matrices is A:
        const IMATH_INTERNAL_NAMESPACE::Matrix44<T> product = U * S_times_Vt;
        for (int i = 0; i < 4; ++i)
            for (int j = 0; j < 4; ++j)
                assert (std::abs (product[i][j] - A[i][j]) <= valueEps);

        // Verify that U and V have positive determinant if requested:
        if (posDet)
        {
            assert (U.determinant () > 0.99);
            assert (V.determinant () > 0.99);
        }

        // Verify that the singular values are sorted:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= S[i + 1]);

        // Verify that all the SVs except maybe the last one are positive:
        for (int i = 0; i < 3; ++i)
            assert (S[i] >= T (0));

        if (!posDet) assert (S[3] >= T (0));

        verifyOrthonormal (U);
        verifyOrthonormal (V);
    }
}